

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_avx512::forward_inplace(PReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  uint *puVar4;
  float *pfVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  undefined1 (*pauVar13) [64];
  ulong uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  
  iVar10 = bottom_top_blob->elempack;
  iVar8 = bottom_top_blob->dims;
  iVar7 = bottom_top_blob->w;
  uVar2 = bottom_top_blob->h;
  if (iVar8 == 3) {
    iVar8 = iVar7 * iVar10 * uVar2;
    uVar11 = 0;
    uVar2 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar2 = 0;
    }
    for (; uVar11 != uVar2; uVar11 = uVar11 + 1) {
      pfVar5 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar18 = *pfVar5;
        auVar22._4_4_ = fVar18;
        auVar22._0_4_ = fVar18;
        auVar22._8_4_ = fVar18;
        auVar22._12_4_ = fVar18;
LAB_002f4175:
        auVar15 = ZEXT3264(CONCAT1616(auVar22,auVar22));
LAB_002f417b:
        auVar24 = auVar15._0_32_;
        auVar15 = vinsertf64x4_avx512f(auVar15,auVar24,1);
      }
      else {
        fVar18 = pfVar5[uVar11];
        if (iVar10 == 4) {
          auVar22 = *(undefined1 (*) [16])(pfVar5 + uVar11 * 4);
          goto LAB_002f4175;
        }
        auVar22._4_4_ = fVar18;
        auVar22._0_4_ = fVar18;
        auVar22._8_4_ = fVar18;
        auVar22._12_4_ = fVar18;
        if (iVar10 == 8) {
          auVar15 = ZEXT3264(*(undefined1 (*) [32])(pfVar5 + uVar11 * 8));
          goto LAB_002f417b;
        }
        auVar24._4_4_ = fVar18;
        auVar24._0_4_ = fVar18;
        auVar24._8_4_ = fVar18;
        auVar24._12_4_ = fVar18;
        auVar24._16_4_ = fVar18;
        auVar24._20_4_ = fVar18;
        auVar24._24_4_ = fVar18;
        auVar24._28_4_ = fVar18;
        auVar15 = ZEXT3264(auVar24);
        if (iVar10 != 0x10) goto LAB_002f417b;
        auVar15 = *(undefined1 (*) [64])(pfVar5 + uVar11 * 0x10);
      }
      pauVar13 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar7 = 0; iVar7 + 0xf < iVar8; iVar7 = iVar7 + 0x10) {
        auVar16 = vmaxps_avx512f(*pauVar13,ZEXT864(0));
        auVar17 = vminps_avx512f(*pauVar13,ZEXT864(0));
        auVar16 = vfmadd213ps_avx512f(auVar17,auVar15,auVar16);
        *pauVar13 = auVar16;
        pauVar13 = pauVar13 + 1;
      }
      for (; iVar7 + 7 < iVar8; iVar7 = iVar7 + 8) {
        auVar23 = vmaxps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar20 = vminps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar21 = vfmadd213ps_fma(auVar20,auVar24,auVar23);
        *(undefined1 (*) [32])*pauVar13 = ZEXT1632(auVar21);
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
      }
      for (; iVar7 + 3 < iVar8; iVar7 = iVar7 + 4) {
        auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar19 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar21 = vfmadd213ps_fma(auVar19,auVar22,auVar21);
        *(undefined1 (*) [16])*pauVar13 = auVar21;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
      }
      for (; iVar7 < iVar8; iVar7 = iVar7 + 1) {
        if (*(float *)*pauVar13 < 0.0) {
          *(float *)*pauVar13 = *(float *)*pauVar13 * fVar18;
        }
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
      }
    }
  }
  else if (iVar8 == 2) {
    iVar7 = iVar7 * iVar10;
    uVar14 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar14;
    }
    for (; uVar14 != uVar11; uVar14 = uVar14 + 1) {
      pfVar5 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar18 = *pfVar5;
        auVar21._4_4_ = fVar18;
        auVar21._0_4_ = fVar18;
        auVar21._8_4_ = fVar18;
        auVar21._12_4_ = fVar18;
LAB_002f4008:
        auVar15 = ZEXT3264(CONCAT1616(auVar21,auVar21));
LAB_002f400e:
        auVar23 = auVar15._0_32_;
        auVar15 = vinsertf64x4_avx512f(auVar15,auVar23,1);
      }
      else {
        fVar18 = pfVar5[uVar14];
        if (iVar10 == 4) {
          auVar21 = *(undefined1 (*) [16])(pfVar5 + uVar14 * 4);
          goto LAB_002f4008;
        }
        auVar21._4_4_ = fVar18;
        auVar21._0_4_ = fVar18;
        auVar21._8_4_ = fVar18;
        auVar21._12_4_ = fVar18;
        if (iVar10 == 8) {
          auVar15 = ZEXT3264(*(undefined1 (*) [32])(pfVar5 + uVar14 * 8));
          goto LAB_002f400e;
        }
        auVar23._4_4_ = fVar18;
        auVar23._0_4_ = fVar18;
        auVar23._8_4_ = fVar18;
        auVar23._12_4_ = fVar18;
        auVar23._16_4_ = fVar18;
        auVar23._20_4_ = fVar18;
        auVar23._24_4_ = fVar18;
        auVar23._28_4_ = fVar18;
        auVar15 = ZEXT3264(auVar23);
        if (iVar10 != 0x10) goto LAB_002f400e;
        auVar15 = *(undefined1 (*) [64])(pfVar5 + uVar14 * 0x10);
      }
      pauVar13 = (undefined1 (*) [64])
                 ((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar8 = 0; iVar8 + 0xf < iVar7; iVar8 = iVar8 + 0x10) {
        auVar16 = vmaxps_avx512f(*pauVar13,ZEXT864(0));
        auVar17 = vminps_avx512f(*pauVar13,ZEXT864(0));
        auVar16 = vfmadd213ps_avx512f(auVar17,auVar15,auVar16);
        *pauVar13 = auVar16;
        pauVar13 = pauVar13 + 1;
      }
      for (; iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
        auVar24 = vmaxps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar20 = vminps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar22 = vfmadd213ps_fma(auVar20,auVar23,auVar24);
        *(undefined1 (*) [32])*pauVar13 = ZEXT1632(auVar22);
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
      }
      for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
        auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar19 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar22 = vfmadd213ps_fma(auVar19,auVar21,auVar22);
        *(undefined1 (*) [16])*pauVar13 = auVar22;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
      }
      for (; iVar8 < iVar7; iVar8 = iVar8 + 1) {
        if (*(float *)*pauVar13 < 0.0) {
          *(float *)*pauVar13 = *(float *)*pauVar13 * fVar18;
        }
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
      }
    }
  }
  else if (iVar8 == 1) {
    iVar10 = iVar10 * iVar7;
    pvVar3 = bottom_top_blob->data;
    puVar4 = (uint *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      auVar15 = vbroadcastss_avx512f(ZEXT416(*puVar4));
      iVar8 = (int)((long)iVar10 / 0x10);
      lVar9 = 0;
      uVar11 = 0;
      if (0 < iVar8) {
        uVar11 = (long)iVar10 / 0x10 & 0xffffffff;
      }
      for (; uVar11 * 0x40 != lVar9; lVar9 = lVar9 + 0x40) {
        auVar16 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar9),ZEXT864(0));
        auVar17 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar9),ZEXT864(0));
        auVar16 = vfmadd213ps_avx512f(auVar17,auVar15,auVar16);
        *(undefined1 (*) [64])((long)pvVar3 + lVar9) = auVar16;
      }
      iVar7 = iVar8 * 0x10;
      uVar11 = (long)(iVar10 + iVar8 * -0x10) / 8;
      iVar8 = (int)uVar11;
      fVar18 = auVar15._0_4_;
      auVar20._4_4_ = fVar18;
      auVar20._0_4_ = fVar18;
      auVar20._8_4_ = fVar18;
      auVar20._12_4_ = fVar18;
      auVar20._16_4_ = fVar18;
      auVar20._20_4_ = fVar18;
      auVar20._24_4_ = fVar18;
      auVar20._28_4_ = fVar18;
      lVar9 = 0;
      uVar14 = 0;
      if (0 < iVar8) {
        uVar14 = uVar11 & 0xffffffff;
      }
      for (; uVar14 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
        auVar24 = *(undefined1 (*) [32])((long)pvVar3 + lVar9 + (long)iVar7 * 4);
        auVar23 = vmaxps_avx(auVar24,ZEXT1632(ZEXT816(0) << 0x40));
        auVar24 = vminps_avx(auVar24,ZEXT1632(ZEXT816(0) << 0x40));
        auVar22 = vfmadd213ps_fma(auVar24,auVar20,auVar23);
        *(undefined1 (*) [32])((long)pvVar3 + lVar9 + (long)iVar7 * 4) = ZEXT1632(auVar22);
      }
      iVar7 = iVar7 + iVar8 * 8;
      uVar11 = (long)(iVar10 - iVar7) / 4;
      auVar19._4_4_ = fVar18;
      auVar19._0_4_ = fVar18;
      auVar19._8_4_ = fVar18;
      auVar19._12_4_ = fVar18;
      lVar9 = 0;
      iVar8 = (int)uVar11;
      uVar14 = 0;
      if (0 < iVar8) {
        uVar14 = uVar11 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        auVar22 = *(undefined1 (*) [16])((long)pvVar3 + lVar9 + (long)iVar7 * 4);
        auVar21 = vmaxps_avx(auVar22,ZEXT416(0) << 0x40);
        auVar22 = vminps_avx(auVar22,ZEXT416(0) << 0x40);
        auVar22 = vfmadd213ps_fma(auVar22,auVar19,auVar21);
        *(undefined1 (*) [16])((long)pvVar3 + lVar9 + (long)iVar7 * 4) = auVar22;
      }
      for (lVar9 = (long)(iVar7 + iVar8 * 4); lVar9 < iVar10; lVar9 = lVar9 + 1) {
        fVar1 = *(float *)((long)pvVar3 + lVar9 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar3 + lVar9 * 4) = fVar1 * fVar18;
        }
      }
    }
    else {
      iVar8 = (int)((long)iVar10 / 0x10);
      lVar9 = 0;
      uVar11 = 0;
      if (0 < iVar8) {
        uVar11 = (long)iVar10 / 0x10 & 0xffffffff;
      }
      for (; uVar11 * 0x40 != lVar9; lVar9 = lVar9 + 0x40) {
        auVar15 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar9),ZEXT1264(ZEXT812(0)));
        auVar16 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar9),ZEXT1264(ZEXT812(0)));
        auVar15 = vfmadd132ps_avx512f(auVar16,auVar15,*(undefined1 (*) [64])((long)puVar4 + lVar9));
        *(undefined1 (*) [64])((long)pvVar3 + lVar9) = auVar15;
      }
      uVar11 = (long)(iVar10 + iVar8 * -0x10) / 8;
      iVar7 = (int)uVar11;
      lVar12 = (long)(iVar8 * 0x10);
      lVar9 = 0;
      uVar14 = 0;
      if (0 < iVar7) {
        uVar14 = uVar11 & 0xffffffff;
      }
      for (; uVar14 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
        auVar24 = *(undefined1 (*) [32])((long)pvVar3 + lVar9 + lVar12 * 4);
        auVar23 = vmaxps_avx(auVar24,ZEXT432(0) << 0x20);
        auVar24 = vminps_avx(auVar24,ZEXT432(0) << 0x20);
        auVar22 = vfmadd132ps_fma(auVar24,auVar23,
                                  *(undefined1 (*) [32])((long)puVar4 + lVar9 + lVar12 * 4));
        *(undefined1 (*) [32])((long)pvVar3 + lVar9 + lVar12 * 4) = ZEXT1632(auVar22);
      }
      iVar8 = iVar8 * 0x10 + iVar7 * 8;
      uVar11 = (long)(iVar10 - iVar8) / 4;
      lVar12 = (long)iVar8;
      lVar9 = 0;
      iVar7 = (int)uVar11;
      uVar14 = 0;
      if (0 < iVar7) {
        uVar14 = uVar11 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        auVar22 = *(undefined1 (*) [16])((long)pvVar3 + lVar9 + lVar12 * 4);
        auVar21 = vmaxps_avx(auVar22,ZEXT416(0) << 0x20);
        auVar22 = vminps_avx(auVar22,ZEXT416(0) << 0x20);
        auVar22 = vfmadd132ps_fma(auVar22,auVar21,
                                  *(undefined1 (*) [16])((long)puVar4 + lVar9 + lVar12 * 4));
        *(undefined1 (*) [16])((long)pvVar3 + lVar9 + lVar12 * 4) = auVar22;
      }
      pvVar6 = (this->super_PReLU).slope_data.data;
      for (lVar9 = (long)(iVar8 + iVar7 * 4); lVar9 < iVar10; lVar9 = lVar9 + 1) {
        fVar18 = *(float *)((long)pvVar3 + lVar9 * 4);
        if (fVar18 < 0.0) {
          *(float *)((long)pvVar3 + lVar9 * 4) = fVar18 * *(float *)((long)pvVar6 + lVar9 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}